

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

Fl_Shared_Image * __thiscall Fl_Help_View::get_image(Fl_Help_View *this,char *name,int W,int H)

{
  Fl_Help_Func *pFVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *__s1;
  Fl_Shared_Image *pFVar5;
  Fl_Shared_Image *this_00;
  char temp [2048];
  char dir [2048];
  char acStack_1038 [2048];
  char local_838 [2056];
  
  __s1 = acStack_1038;
  pcVar4 = this->directory_;
  pcVar3 = strchr(pcVar4,0x3a);
  if ((pcVar3 == (char *)0x0) || (pcVar3 = strchr(name,0x3a), pcVar3 != (char *)0x0)) {
    if ((*name == '/') || (pcVar3 = strchr(name,0x3a), pcVar3 != (char *)0x0)) {
      pFVar1 = this->link_;
      __s1 = name;
      goto joined_r0x001b2686;
    }
    if (*pcVar4 != '\0') goto LAB_001b26f5;
    pcVar4 = local_838;
    fl_getcwd(pcVar4,0x800);
    pcVar3 = "file:%s/%s";
LAB_001b271a:
    snprintf(acStack_1038,0x800,pcVar3,pcVar4,name);
  }
  else {
    if (*name != '/') {
LAB_001b26f5:
      pcVar3 = "%s/%s";
      goto LAB_001b271a;
    }
    fl_strlcpy(acStack_1038,pcVar4,0x800);
    pcVar4 = strchr(pcVar4,0x3a);
    pcVar4 = strrchr(pcVar4 + 3,0x2f);
    if (pcVar4 == (char *)0x0) {
      fl_strlcat(acStack_1038,name,0x800);
    }
    else {
      fl_strlcpy(pcVar4,name,(size_t)(local_838 + -(long)pcVar4));
    }
  }
  pFVar1 = this->link_;
joined_r0x001b2686:
  if (pFVar1 != (Fl_Help_Func *)0x0) {
    __s1 = (*pFVar1)((Fl_Widget *)this,__s1);
  }
  if (__s1 == (char *)0x0) {
    this_00 = (Fl_Shared_Image *)0x0;
  }
  else {
    iVar2 = strncmp(__s1,"file:",5);
    if (initial_load == '\x01') {
      pFVar5 = Fl_Shared_Image::get(__s1 + (ulong)(iVar2 == 0) * 5,W,H);
      this_00 = (Fl_Shared_Image *)&broken_image;
      if (pFVar5 != (Fl_Shared_Image *)0x0) {
        this_00 = pFVar5;
      }
    }
    else {
      this_00 = Fl_Shared_Image::find(__s1 + (ulong)(iVar2 == 0) * 5,W,H);
      if (this_00 == (Fl_Shared_Image *)0x0) {
        this_00 = (Fl_Shared_Image *)&broken_image;
      }
      else {
        Fl_Shared_Image::release(this_00);
      }
    }
  }
  return this_00;
}

Assistant:

Fl_Shared_Image *
Fl_Help_View::get_image(const char *name, int W, int H) {
  const char	*localname;		// Local filename
  char		dir[FL_PATH_MAX];	// Current directory
  char		temp[FL_PATH_MAX],	// Temporary filename
		*tempptr;		// Pointer into temporary name
  Fl_Shared_Image *ip;			// Image pointer...

  // See if the image can be found...
  if (strchr(directory_, ':') != NULL && strchr(name, ':') == NULL) {
    if (name[0] == '/') {
      strlcpy(temp, directory_, sizeof(temp));

      if ((tempptr = strrchr(strchr(directory_, ':') + 3, '/')) != NULL) {
        strlcpy(tempptr, name, sizeof(temp) - (tempptr - temp));
      } else {
        strlcat(temp, name, sizeof(temp));
      }
    } else {
      snprintf(temp, sizeof(temp), "%s/%s", directory_, name);
    }

    if (link_) localname = (*link_)(this, temp);
    else localname = temp;
  } else if (name[0] != '/' && strchr(name, ':') == NULL) {
    if (directory_[0]) snprintf(temp, sizeof(temp), "%s/%s", directory_, name);
    else {
      fl_getcwd(dir, sizeof(dir));
      snprintf(temp, sizeof(temp), "file:%s/%s", dir, name);
    }

    if (link_) localname = (*link_)(this, temp);
    else localname = temp;
  } else if (link_) localname = (*link_)(this, name);
  else localname = name;

  if (!localname) return 0;

  if (strncmp(localname, "file:", 5) == 0) localname += 5;

  if (initial_load) {
    if ((ip = Fl_Shared_Image::get(localname, W, H)) == NULL) {
      ip = (Fl_Shared_Image *)&broken_image;
    }
  } else { // draw or resize
    if ((ip = Fl_Shared_Image::find(localname, W, H)) == NULL) {
      ip = (Fl_Shared_Image *)&broken_image;
    } else {
      ip->release();
    }
  }

  return ip;
}